

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Secret_Input::handle(Fl_Secret_Input *this,int event)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Fl_Window *pFVar13;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RDX;
  uint p;
  int iVar14;
  Fl_Boxtype FVar15;
  
  iVar12 = Fl_Input::handle::dnd_save_mark;
  switch(event) {
  case 1:
    iVar12 = Fl::dnd_text_ops();
    if (iVar12 != 0) {
      iVar12 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar14 = (this->super_Fl_Input).super_Fl_Input_.position_;
      iVar4 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar15 = (Fl_Boxtype)bVar1;
      iVar10 = Fl::box_dx(FVar15);
      iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar11 = Fl::box_dy((uint)bVar1);
      iVar8 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar6 = Fl::box_dw(FVar15);
      iVar9 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar7 = Fl::box_dh(FVar15);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar12 + iVar10,iVar5 + iVar11,iVar8 - iVar6,iVar9 - iVar7,0);
      Fl_Input::handle::newpos = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input_::position((Fl_Input_ *)this,iVar14,iVar4);
      if ((((Fl::focus_ == (Fl_Widget *)this) && ((Fl::e_state & 0x10000U) == 0)) &&
          (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) != 5)) &&
         (Fl_Input::handle::newpos < (this->super_Fl_Input).super_Fl_Input_.position_ !=
          Fl_Input::handle::newpos < (this->super_Fl_Input).super_Fl_Input_.mark_)) {
        Fl_Input::handle::drag_start = Fl_Input::handle::newpos;
        return 1;
      }
      Fl_Input::handle::drag_start = -1;
    }
    if (Fl::focus_ != (Fl_Widget *)this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    if (Fl::e_keysym == 0xfeea) {
      Fl::e_is_click = 0;
      Fl::paste((Fl_Widget *)this,0);
      goto LAB_001b8059;
    }
    if (Fl::e_is_click != 0) {
      in_RDX = (EVP_PKEY_CTX *)(ulong)(uint)Fl_Input::handle::drag_start;
      if (-1 < Fl_Input::handle::drag_start) {
        Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::drag_start,
                            Fl_Input::handle::drag_start);
        Fl_Input::handle::drag_start = -1;
        goto LAB_001b8059;
      }
      if (Fl::e_clicks == 0) goto LAB_001b8059;
    }
    Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,in_RDX);
LAB_001b8059:
    if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 8) != 0) {
      Fl_Widget::do_callback((Fl_Widget *)this);
    }
    return 1;
  case 3:
  case 4:
  case 7:
    break;
  case 5:
    iVar12 = Fl::dnd_text_ops();
    if ((iVar12 != 0) && (-1 < Fl_Input::handle::drag_start)) {
      if (Fl::e_is_click != 0) {
        return 1;
      }
      Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
      Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)this;
      Fl_Input_::copy((Fl_Input_ *)this,(EVP_PKEY_CTX *)0x0,src);
      Fl::dnd();
      return 1;
    }
    break;
  case 6:
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar12 = (this->super_Fl_Input).super_Fl_Input_.size_;
      break;
    case 0xff52:
      iVar12 = Fl_Input_::line_start((Fl_Input_ *)this,(this->super_Fl_Input).super_Fl_Input_.size_)
      ;
      goto LAB_001b7f90;
    case 0xff53:
      iVar12 = 0;
      break;
    case 0xff54:
      iVar12 = 0;
LAB_001b7f90:
      Fl_Input_::up_down_position((Fl_Input_ *)this,iVar12,0);
      goto switchD_001b7af5_caseD_3;
    default:
      if (Fl::e_keysym == 0xff09) {
        iVar12 = (this->super_Fl_Input).super_Fl_Input_.size_;
        iVar14 = 0;
      }
      else {
        iVar12 = (this->super_Fl_Input).super_Fl_Input_.position_;
        iVar14 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      }
      Fl_Input_::position((Fl_Input_ *)this,iVar12,iVar14);
      goto switchD_001b7af5_caseD_3;
    }
    Fl_Input_::position((Fl_Input_ *)this,iVar12);
    break;
  case 8:
    if ((((Fl::e_keysym == 0xff09) &&
         ((Fl::e_state & 0x10000U) == 0 && (this->super_Fl_Input).super_Fl_Input_.tab_nav_ == 0)) &&
        (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.type_ & 7) == 4)) &&
       (uVar2 = (this->super_Fl_Input).super_Fl_Input_.size_, 0 < (int)uVar2)) {
      p = (this->super_Fl_Input).super_Fl_Input_.position_;
      uVar3 = (this->super_Fl_Input).super_Fl_Input_.mark_;
      if ((p == uVar2 && uVar3 == 0) || (uVar2 == uVar3 && p == 0)) {
        if (p < uVar3) {
          p = uVar3;
        }
        Fl_Input_::position((Fl_Input_ *)this,p);
        return 1;
      }
    }
    iVar12 = Fl_Widget::active_r((Fl_Widget *)this);
    if (((iVar12 != 0) &&
        (pFVar13 = Fl_Widget::window((Fl_Widget *)this), pFVar13 != (Fl_Window *)0x0)) &&
       (Fl::belowmouse_ == (Fl_Widget *)this)) {
      pFVar13 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar13,FL_CURSOR_NONE);
    }
    iVar12 = Fl_Input::handle_key(&this->super_Fl_Input);
    return iVar12;
  default:
    switch(event) {
    case 0x14:
      Fl::belowmouse((Fl_Widget *)this);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this) {
        Fl_Input::handle::dnd_save_position = (this->super_Fl_Input).super_Fl_Input_.position_;
        Fl_Input::handle::dnd_save_mark = (this->super_Fl_Input).super_Fl_Input_.mark_;
        Fl_Input::handle::dnd_save_focus = Fl::focus_;
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
    case 0x15:
      bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
      FVar15 = (Fl_Boxtype)bVar1;
      iVar12 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
      iVar8 = Fl::box_dx(FVar15);
      iVar14 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
      iVar9 = Fl::box_dy((uint)bVar1);
      iVar4 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
      iVar10 = Fl::box_dw(FVar15);
      iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
      iVar11 = Fl::box_dh(FVar15);
      Fl_Input_::handle_mouse
                ((Fl_Input_ *)this,iVar12 + iVar8,iVar14 + iVar9,iVar4 - iVar10,iVar5 - iVar11,0);
      return 1;
    case 0x16:
      Fl_Input_::position((Fl_Input_ *)this,Fl_Input::handle::dnd_save_position,
                          Fl_Input::handle::dnd_save_mark);
      if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)this &&
          Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        Fl::focus(Fl_Input::handle::dnd_save_focus);
        (*(this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget._vptr_Fl_Widget[3])(this,7);
      }
      pFVar13 = Fl::first_window();
      Fl_Window::cursor(pFVar13,FL_CURSOR_MOVE);
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      return 1;
    case 0x17:
      if (Fl_Input::handle::dnd_save_focus == (Fl_Widget *)this) {
        iVar14 = (this->super_Fl_Input).super_Fl_Input_.position_;
        if (Fl_Input::handle::dnd_save_position < Fl_Input::handle::dnd_save_mark) {
          Fl_Input::handle::dnd_save_mark = Fl_Input::handle::dnd_save_position;
          Fl_Input::handle::dnd_save_position = iVar12;
        }
        Fl_Input_::replace((Fl_Input_ *)this,Fl_Input::handle::dnd_save_mark,
                           Fl_Input::handle::dnd_save_position,(char *)0x0,0);
        if (iVar14 - Fl_Input::handle::dnd_save_position != 0 &&
            Fl_Input::handle::dnd_save_position <= iVar14) {
          iVar14 = (iVar14 - Fl_Input::handle::dnd_save_position) + Fl_Input::handle::dnd_save_mark;
        }
        Fl_Input_::position((Fl_Input_ *)this,iVar14);
      }
      else if (Fl_Input::handle::dnd_save_focus != (Fl_Widget *)0x0) {
        (*Fl_Input::handle::dnd_save_focus->_vptr_Fl_Widget[3])(Fl_Input::handle::dnd_save_focus,7);
      }
      Fl_Input::handle::dnd_save_focus = (Fl_Widget *)0x0;
      Fl_Widget::take_focus((Fl_Widget *)this);
      return 1;
    }
  }
switchD_001b7af5_caseD_3:
  bVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.box_;
  FVar15 = (Fl_Boxtype)bVar1;
  iVar12 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
  iVar8 = Fl::box_dx(FVar15);
  iVar14 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
  iVar9 = Fl::box_dy((uint)bVar1);
  iVar4 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  iVar10 = Fl::box_dw(FVar15);
  iVar5 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.h_;
  iVar11 = Fl::box_dh(FVar15);
  iVar12 = Fl_Input_::handletext
                     ((Fl_Input_ *)this,event,iVar12 + iVar8,iVar14 + iVar9,iVar4 - iVar10,
                      iVar5 - iVar11);
  return iVar12;
}

Assistant:

int Fl_Secret_Input::handle(int event) {
  int retval = Fl_Input::handle(event);
#ifdef __APPLE__
  if (event == FL_KEYBOARD && Fl::compose_state) {
    this->mark( this->position() ); // don't underline marked text
  }
#endif
  return retval;
}